

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agent.c
# Opt level: O0

long get_ia(void)

{
  long lVar1;
  double dVar2;
  
  dVar2 = generate(cfg->idist);
  lVar1 = lround(dVar2 * 1000.0);
  return lVar1;
}

Assistant:

long get_ia(void)
{
	return lround(generate(cfg->idist) * 1000);
}